

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O1

type_conflict2 __thiscall
PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
          (Memory *this,Source segment,uint16_t offset)

{
  uint uVar1;
  Segments *pSVar2;
  undefined3 in_register_00000031;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000031,segment);
  pSVar2 = this->segments_;
  if (iVar3 != 8) {
    if (iVar3 == 9) {
      pSVar2 = (Segments *)&pSVar2->cs_base_;
    }
    else if (iVar3 == 10) {
      pSVar2 = (Segments *)&pSVar2->ss_base_;
    }
    else {
      pSVar2 = (Segments *)&pSVar2->ds_base_;
    }
  }
  uVar1 = pSVar2->es_base_ + (uint)offset & 0xfffff;
  if (offset != 0xffff) {
    if (uVar1 == 0xfffff) {
      return (ushort)(*(int *)(this->memory)._M_elems << 8) |
             (ushort)(this->memory)._M_elems[0xfffff];
    }
    return *(type_conflict2 *)((this->memory)._M_elems + uVar1);
  }
  pSVar2 = this->segments_;
  if (segment != ES) {
    if (segment == CS) {
      pSVar2 = (Segments *)&pSVar2->cs_base_;
    }
    else if (segment == SS) {
      pSVar2 = (Segments *)&pSVar2->ss_base_;
    }
    else {
      pSVar2 = (Segments *)&pSVar2->ds_base_;
    }
  }
  return CONCAT11((this->memory)._M_elems[pSVar2->es_base_ & 0xfffff],(this->memory)._M_elems[uVar1]
                 );
}

Assistant:

uint32_t segment_base(InstructionSet::x86::Source segment) {
			using Source = InstructionSet::x86::Source;
			switch(segment) {
				default:			return segments_.ds_base_;
				case Source::ES:	return segments_.es_base_;
				case Source::CS:	return segments_.cs_base_;
				case Source::SS:	return segments_.ss_base_;
			}
		}